

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatFile.cpp
# Opt level: O0

int __thiscall DatUnpacker::DatFile::size(DatFile *this)

{
  uint position;
  int iVar1;
  ulong uVar2;
  int value;
  int oldPosition;
  DatFile *this_local;
  
  position = DatFile::position(this);
  uVar2 = std::ifstream::is_open();
  if ((uVar2 & 1) != 0) {
    std::istream::seekg((long)&this->_ifstream,_S_beg);
  }
  uVar2 = std::ofstream::is_open();
  if ((uVar2 & 1) != 0) {
    std::ostream::seekp((long)&this->_ofstream,_S_beg);
  }
  iVar1 = DatFile::position(this);
  setPosition(this,position);
  return iVar1;
}

Assistant:

int DatFile::size()
    {
        int oldPosition = position();

        if (_ifstream.is_open())
        {
            _ifstream.seekg(0, std::ios::end);
        }

        if (_ofstream.is_open())
        {
            _ofstream.seekp(0, std::ios::end);
        }

        int value = position();
        setPosition(oldPosition);
        return value;
    }